

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoding.c
# Opt level: O3

exr_result_t
exr_decoding_initialize
          (exr_const_context_t ctxt,int part_index,exr_chunk_info_t *cinfo,
          exr_decode_pipeline_t *decode)

{
  uint uVar1;
  exr_const_priv_part_t part;
  exr_attribute_t *peVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  int32_t iVar8;
  int32_t iVar9;
  int32_t iVar10;
  int32_t iVar11;
  uint8_t uVar12;
  uint8_t uVar13;
  uint8_t uVar14;
  uint8_t uVar15;
  exr_result_t eVar16;
  
  if (ctxt == (exr_const_context_t)0x0) {
    eVar16 = 2;
  }
  else {
    if (cinfo == (exr_chunk_info_t *)0x0 || decode == (exr_decode_pipeline_t *)0x0) {
      eVar16 = (*ctxt->standard_error)(ctxt,3);
      return eVar16;
    }
    eVar16 = 4;
    if ((-1 < part_index) && (part_index < ctxt->num_parts)) {
      part = ctxt->parts[(uint)part_index];
      memset(decode,0,0x1f8);
      if (((part->storage_mode & ~EXR_STORAGE_TILED) == EXR_STORAGE_DEEP_SCANLINE) &&
         ((part->version != (exr_attribute_t *)0x0 &&
          (uVar1 = (part->version->field_6).i, uVar1 != 1)))) {
        eVar16 = (*ctxt->print_error)
                           (ctxt,0xe,
                            "Version %d not supported for deepscanline images in this version of the library"
                            ,(ulong)uVar1,ctxt->print_error);
        return eVar16;
      }
      peVar2 = part->channels;
      eVar16 = 0xe;
      if (((peVar2 != (exr_attribute_t *)0x0) && (peVar2->type == EXR_ATTR_CHLIST)) &&
         (0 < (((peVar2->field_6).box2i)->min).x)) {
        eVar16 = internal_coding_fill_channel_info
                           (&decode->channels,&decode->channel_count,decode->_quick_chan_store,cinfo
                            ,ctxt,part);
        if (eVar16 == 0) {
          decode->part_index = part_index;
          decode->context = ctxt;
          iVar8 = cinfo->start_x;
          iVar9 = cinfo->start_y;
          iVar10 = cinfo->height;
          iVar11 = cinfo->width;
          uVar12 = cinfo->level_x;
          uVar13 = cinfo->level_y;
          uVar14 = cinfo->type;
          uVar15 = cinfo->compression;
          uVar3 = cinfo->data_offset;
          uVar4 = cinfo->packed_size;
          uVar5 = cinfo->unpacked_size;
          uVar6 = cinfo->sample_count_data_offset;
          uVar7 = cinfo->sample_count_table_size;
          (decode->chunk).idx = cinfo->idx;
          (decode->chunk).start_x = iVar8;
          (decode->chunk).start_y = iVar9;
          (decode->chunk).height = iVar10;
          (decode->chunk).width = iVar11;
          (decode->chunk).level_x = uVar12;
          (decode->chunk).level_y = uVar13;
          (decode->chunk).type = uVar14;
          (decode->chunk).compression = uVar15;
          (decode->chunk).data_offset = uVar3;
          (decode->chunk).packed_size = uVar4;
          (decode->chunk).unpacked_size = uVar5;
          (decode->chunk).sample_count_data_offset = uVar6;
          (decode->chunk).sample_count_table_size = uVar7;
          eVar16 = 0;
        }
      }
    }
  }
  return eVar16;
}

Assistant:

exr_result_t
exr_decoding_initialize (
    exr_const_context_t     ctxt,
    int                     part_index,
    const exr_chunk_info_t* cinfo,
    exr_decode_pipeline_t*  decode)
{
    exr_result_t          rv;
    exr_decode_pipeline_t nil = {0};
    exr_const_priv_part_t part;

    if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;

    if (!cinfo || !decode)
        return ctxt->standard_error (ctxt, EXR_ERR_INVALID_ARGUMENT);

    if (part_index < 0 || part_index >= ctxt->num_parts)
        return EXR_ERR_ARGUMENT_OUT_OF_RANGE;

    part = ctxt->parts[part_index];

    *decode = nil;

    if (part->storage_mode == EXR_STORAGE_DEEP_SCANLINE ||
        part->storage_mode == EXR_STORAGE_DEEP_TILED)
    {
        if (part->version && part->version->i != 1)
        {
            return ctxt->print_error (
                ctxt,
                EXR_ERR_INVALID_ATTR,
                "Version %d not supported for deepscanline images in this version of the library",
                part->version->i);
        }
    }

    /* will have already been reported during header parse, but just
     * stop the file from being read
     */
    if (!part->channels || part->channels->type != EXR_ATTR_CHLIST ||
        part->channels->chlist->num_channels <= 0)
        return EXR_ERR_INVALID_ATTR;

    rv = internal_coding_fill_channel_info (
        &(decode->channels),
        &(decode->channel_count),
        decode->_quick_chan_store,
        cinfo,
        ctxt,
        part);

    if (rv == EXR_ERR_SUCCESS)
    {
        decode->part_index = part_index;
        decode->context    = ctxt;
        decode->chunk      = *cinfo;
    }
    return rv;
}